

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_fail_result
          (connection<websocketpp::config::asio> *this)

{
  element_type *peVar1;
  error_category *peVar2;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  string *in_RCX;
  string ua;
  stringstream s;
  allocator local_24a;
  allocator local_249;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  iVar3 = processor::get_websocket_version<websocketpp::http::parser::request>(&this->m_request);
  std::operator<<(local_198,"WebSocket Connection ");
  transport::asio::connection<websocketpp::config::asio::transport_config>::
  get_remote_endpoint_abi_cxx11_(&local_228,&this->super_transport_con_type);
  std::operator<<(local_198,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  if (iVar3 < 0) {
    std::operator<<(local_198," -");
  }
  else {
    poVar4 = std::operator<<(local_198," v");
    std::ostream::operator<<(poVar4,iVar3);
  }
  std::__cxx11::string::string((string *)&local_248,"User-Agent",(allocator *)&local_208);
  psVar5 = http::parser::parser::get_header(&(this->m_request).super_parser,&local_248);
  std::__cxx11::string::string((string *)&local_228,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_248);
  if (local_228._M_string_length == 0) {
    std::operator<<(local_198," \"\" ");
  }
  else {
    poVar4 = std::operator<<(local_198," \"");
    std::__cxx11::string::string((string *)&local_1c8,(string *)&local_228);
    std::__cxx11::string::string((string *)&local_208,"\"",&local_249);
    std::__cxx11::string::string((string *)&local_1e8,"\\\"",&local_24a);
    in_RCX = &local_1e8;
    utility::string_replace_all(&local_248,&local_1c8,&local_208,in_RCX);
    poVar4 = std::operator<<(poVar4,(string *)&local_248);
    std::operator<<(poVar4,"\" ");
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  peVar1 = (this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::string((string *)&local_248,"-",(allocator *)&local_208);
  }
  else {
    std::__cxx11::string::string((string *)&local_248,(string *)&peVar1->m_resource);
  }
  std::operator<<(local_198,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  poVar4 = std::operator<<(local_198," ");
  std::ostream::operator<<(poVar4,(this->m_response).m_status_code);
  poVar4 = std::operator<<(local_198," ");
  pbVar6 = std::operator<<(poVar4,&this->m_ec);
  poVar4 = std::operator<<(pbVar6," ");
  peVar2 = (this->m_ec)._M_cat;
  (**(code **)(*(long *)peVar2 + 0x20))(&local_248,peVar2,(this->m_ec)._M_value);
  std::operator<<(poVar4,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_00,0x2000,&local_248,(size_t)in_RCX);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void connection<config>::log_fail_result()
{
    std::stringstream s;
    
    int version = processor::get_websocket_version(m_request);

    // Connection Type
    s << "WebSocket Connection ";

    // Remote endpoint address & WebSocket version
    s << transport_con_type::get_remote_endpoint();
    if (version < 0) {
        s << " -";
    } else {
        s << " v" << version;
    }

    // User Agent
    std::string ua = m_request.get_header("User-Agent");
    if (ua.empty()) {
        s << " \"\" ";
    } else {
        // check if there are any quotes in the user agent
        s << " \"" << utility::string_replace_all(ua,"\"","\\\"") << "\" ";
    }

    // URI
    s << (m_uri ? m_uri->get_resource() : "-");

    // HTTP Status code
    s  << " " << m_response.get_status_code();
    
    // WebSocket++ error code & reason
    s << " " << m_ec << " " << m_ec.message();

    m_alog->write(log::alevel::fail,s.str());
}